

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O3

bool __thiscall r_exec::HLPContext::evaluate_no_dereference(HLPContext *this,uint16_t *result_index)

{
  _func_bool_Context_ptr_uint16_t_ptr *p_Var1;
  _func_bool_Context_ptr_uint16_t_ptr *p_Var2;
  Atom *pAVar3;
  BindingMap *this_00;
  uint16_t *puVar4;
  bool bVar5;
  uint8_t id;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  Operator *pOVar9;
  Atom *intermediate_results;
  uint uVar10;
  byte bVar11;
  uint16_t unused_result_index;
  Context _c;
  uint16_t local_7a;
  uint16_t *local_78;
  HLPContext local_70;
  HLPContext local_50;
  
  uVar10 = (this->super__Context).data - VALUE_ARRAY;
  if (uVar10 < 3) {
    bVar11 = 3 >> ((byte)uVar10 & 7);
    goto LAB_00175661;
  }
  bVar11 = r_code::Atom::getDescriptor();
  uVar10 = bVar11 - 0xc1;
  if (uVar10 < 0xe) {
    local_78 = result_index;
    if ((0x3f8fU >> (uVar10 & 0x1f) & 1) == 0) {
      if (uVar10 == 4) {
        iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
        if ((ushort)iVar8 != 0) {
          uVar6 = 1;
          do {
            HLPContext(&local_50,(this->super__Context).code,(this->super__Context).index + uVar6,
                       (HLPOverlay *)(this->super__Context).overlay,STEM);
            operator*(&local_70,&local_50);
            bVar5 = evaluate_no_dereference(&local_70,&local_7a);
            if (!bVar5) goto LAB_0017565f;
            uVar6 = uVar6 + 1;
          } while (uVar6 <= (ushort)iVar8);
        }
        uVar6 = r_code::Atom::asOpcode();
        pOVar9 = r_code::vector<r_exec::Operator>::operator[]
                           ((vector<r_exec::Operator> *)Operator::Operators,(ulong)uVar6);
        p_Var1 = pOVar9->_operator;
        p_Var2 = pOVar9->_overload;
        local_70.super__Context.overlay = (Overlay *)operator_new(0x20);
        puVar4 = local_78;
        pAVar3 = (this->super__Context).code;
        ((local_70.super__Context.overlay)->super__Object).refCount.super___atomic_base<long>._M_i =
             (__int_type)(this->super__Context).overlay;
        ((local_70.super__Context.overlay)->invalidated).super___atomic_base<unsigned_long>._M_i =
             (__int_type_conflict)pAVar3;
        (local_70.super__Context.overlay)->controller =
             *(Controller **)&(this->super__Context).index;
        ((local_70.super__Context.overlay)->super__Object)._vptr__Object =
             (_func_int **)&PTR___Context_001c0010;
        local_70.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be520;
        bVar5 = (*p_Var1)((Context *)&local_70,local_78);
        bVar11 = true;
        if (!bVar5) {
          if (p_Var2 == (_func_bool_Context_ptr_uint16_t_ptr *)0x0) {
            bVar11 = false;
          }
          else {
            bVar11 = (*p_Var2)((Context *)&local_70,puVar4);
          }
        }
        local_70.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be520;
        if (local_70.super__Context.overlay != (Overlay *)0x0) {
          (*((local_70.super__Context.overlay)->super__Object)._vptr__Object[1])();
        }
        goto LAB_00175661;
      }
      goto LAB_00175676;
    }
    iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
    if ((ushort)iVar8 != 0) {
      uVar6 = 1;
      do {
        HLPContext(&local_50,(this->super__Context).code,(this->super__Context).index + uVar6,
                   (HLPOverlay *)(this->super__Context).overlay,STEM);
        operator*(&local_70,&local_50);
        bVar5 = evaluate_no_dereference(&local_70,&local_7a);
        if (!bVar5) goto LAB_0017565f;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= (ushort)iVar8);
    }
    *local_78 = (this->super__Context).index;
  }
  else {
LAB_00175676:
    if (bVar11 == 0x8d) {
      pAVar3 = (this->super__Context).code;
      uVar7 = r_code::Atom::asIndex();
      HLPContext(&local_70,pAVar3,uVar7,(HLPOverlay *)(this->super__Context).overlay,STEM);
      bVar11 = evaluate_no_dereference(&local_70,result_index);
      if ((bool)bVar11) {
        pAVar3 = (this->super__Context).code;
        this_00 = (BindingMap *)(this->super__Context).overlay[1].super__Object._vptr__Object;
        id = r_code::Atom::asAssignmentIndex();
        uVar7 = r_code::Atom::asIndex();
        intermediate_results =
             r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
        BindingMap::bind_variable(this_00,pAVar3,id,uVar7,intermediate_results);
      }
      goto LAB_00175661;
    }
    *result_index = (this->super__Context).index;
  }
  bVar11 = 1;
LAB_00175661:
  return (bool)(bVar11 & 1);
LAB_0017565f:
  bVar11 = 0;
  goto LAB_00175661;
}

Assistant:

bool HLPContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case VALUE_ARRAY:
    case BINDING_MAP:
        return true;

    case UNDEFINED:
        return false;

    default:
        break;
    }

    switch (code[index].getDescriptor()) {
    case Atom::ASSIGN_PTR: {
        HLPContext c(code, code[index].asIndex(), (HLPOverlay *)overlay);

        if (c.evaluate_no_dereference(result_index)) {
            ((HLPOverlay *)overlay)->bindings->bind_variable(code, code[index].asAssignmentIndex(), code[index].asIndex(), &overlay->values[0]);
            return true;
        } else {
            return false;
        }
    }

    case Atom::OPERATOR: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        Operator op = Operator::Get((*this)[0].asOpcode());
        HLPContext *c = new HLPContext(*this);
        Context _c(c);
        return op(_c, result_index);
    }

    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}